

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O3

string * __thiscall
ZXing::OneD::DataBar::DecodeAI013x0x1x_abi_cxx11_
          (string *__return_storage_ptr__,DataBar *this,BitArrayView *bits,char *aiPrefix,
          char *dateCode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint __val;
  string *psVar2;
  int iVar3;
  undefined4 extraout_var;
  string *psVar4;
  string *extraout_RAX;
  int iVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  string __str;
  string local_60;
  string *local_40;
  char *local_38;
  
  pcVar6 = aiPrefix;
  DecodeAI01GTIN_abi_cxx11_(__return_storage_ptr__,this,bits);
  iVar5 = (int)pcVar6;
  local_40 = __return_storage_ptr__;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_38 = aiPrefix;
  iVar3 = BitArrayView::peakBits((BitArrayView *)this,0x14);
  *(long *)(this + 8) = *(long *)(this + 8) + 0x14;
  uVar8 = iVar3 / 100000;
  __val = -uVar8;
  if (0 < (int)uVar8) {
    __val = uVar8;
  }
  uVar8 = 1;
  if (((9 < __val) && (uVar8 = 2, 99 < __val)) && (uVar8 = 3, 999 < __val)) {
    uVar8 = 5 - (__val < 10000);
  }
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_60,(iVar3 < -99999) + (char)uVar8);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_60._M_dataplus._M_p + (iVar3 < -99999),uVar8,__val);
  psVar2 = local_40;
  std::__cxx11::string::_M_append((char *)local_40,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  ToString<int,void>(&local_60,(ZXing *)(ulong)(uint)(iVar3 % 100000),6,iVar5);
  std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  iVar3 = BitArrayView::peakBits((BitArrayView *)this,0x10);
  psVar4 = (string *)CONCAT44(extraout_var,iVar3);
  *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
  if (iVar3 != 0x9600) {
    std::__cxx11::string::append((char *)psVar2);
    iVar7 = iVar3 + 0x1f;
    if (-1 < iVar3) {
      iVar7 = iVar3;
    }
    ToString<int,void>(&local_60,(ZXing *)(ulong)(uint)(iVar3 / 0x180),2,iVar5);
    std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_60._M_dataplus._M_p);
    iVar5 = (((uint)((iVar7 >> 5) / 6 + (iVar7 >> 0x1f)) >> 1) - (iVar7 >> 0x1f)) * -0xc;
    iVar7 = (iVar7 >> 5) + iVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    ToString<int,void>(&local_60,(ZXing *)(ulong)(iVar7 + 1),2,iVar5);
    std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    ToString<int,void>(&local_60,(ZXing *)(ulong)(uint)(iVar3 % 0x20),2,iVar5);
    psVar4 = (string *)
             std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      psVar4 = extraout_RAX;
    }
  }
  return psVar4;
}

Assistant:

static std::string DecodeAI013x0x1x(BitArrayView& bits, const char* aiPrefix, const char* dateCode)
{
	std::string buffer = DecodeAI01GTIN(bits);
	buffer.append(aiPrefix);

	int weight = bits.readBits(20);
	buffer.append(std::to_string(weight / 100000));
	buffer.append(ToString(weight % 100000, 6));

	int date = bits.readBits(16);
	if (date != 38400) {
		buffer.append(dateCode);

		int day = date % 32;
		date /= 32;
		int month = date % 12 + 1;
		date /= 12;
		int year = date;

		buffer.append(ToString(year, 2));
		buffer.append(ToString(month, 2));
		buffer.append(ToString(day, 2));
	}

	return buffer;
}